

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O0

void do_cmd_choose_map(command_conflict *cmd)

{
  int local_14;
  command_conflict *pcStack_10;
  wchar_t choice;
  command_conflict *cmd_local;
  
  local_14 = 0;
  world = maps;
  pcStack_10 = cmd;
  cmd_get_arg_choice((command *)cmd,"choice",&local_14);
  for (; local_14 != 0; local_14 = local_14 + -1) {
    world = world->next;
  }
  player_generate(player,(player_race *)0x0,(player_class *)0x0,false);
  reset_stats(stats,points_spent,points_inc,&points_left,false);
  generate_stats(stats,points_spent,points_inc,&points_left);
  rolled_stats = false;
  return;
}

Assistant:

void do_cmd_choose_map(struct command *cmd)
{
	int choice = 0;
	world = maps;
	cmd_get_arg_choice(cmd, "choice", &choice);
	while (choice) {
		world = world->next;
		choice--;
	}
	player_generate(player, NULL, NULL, false);

	reset_stats(stats, points_spent, points_inc, &points_left, false);
	generate_stats(stats, points_spent, points_inc, &points_left);
	rolled_stats = false;
}